

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendCompileOptions
          (cmLocalGenerator *this,string *options,string *options_list,char *regex)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  ulong uVar1;
  container_type *options_vec_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  cmList options_vec;
  char *regex_local;
  string *options_list_local;
  string *options_local;
  cmLocalGenerator *this_local;
  
  options_vec.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)regex;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)options_list);
    local_50 = &local_70;
    local_48 = 1;
    init._M_len = 1;
    init._M_array = local_50;
    cmList::cmList((cmList *)local_40,init);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_98 = local_98 + -1;
      std::__cxx11::string::~string((string *)local_98);
    } while (local_98 != &local_70);
    options_vec_00 = cmList::operator_cast_to_vector_((cmList *)local_40);
    AppendCompileOptions
              (this,options,options_vec_00,
               (char *)options_vec.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmList::~cmList((cmList *)local_40);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendCompileOptions(std::string& options,
                                            std::string const& options_list,
                                            const char* regex) const
{
  // Short-circuit if there are no options.
  if (options_list.empty()) {
    return;
  }

  // Expand the list of options.
  cmList options_vec{ options_list };
  this->AppendCompileOptions(options, options_vec, regex);
}